

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall TimerHeap::pop(TimerHeap *this,size_t index)

{
  pointer psVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  size_t sVar5;
  
  psVar1 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar5 = ((long)psVar2 - (long)psVar1 >> 4) - 1;
  if (sVar5 != index) {
    peVar4 = psVar1[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar1[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[sVar5].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar1[sVar5].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    p_Var3 = psVar1[sVar5].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    psVar1[sVar5].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         psVar1[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    psVar1[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
    psVar1 = (this->timerHeap_).
             super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->timerHeap_).
    super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar1 + -1;
    p_Var3 = psVar1[-1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    modify(this,index);
    return;
  }
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar2 + -1;
  p_Var3 = psVar2[-1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

void TimerHeap::pop(size_t index) {
    if (timerHeap_.size() - 1 == index) {
        timerHeap_.pop_back();
    } else {
        swapHeap(index, timerHeap_.size() - 1);
        timerHeap_.pop_back();
        modify(index);
    }
}